

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.h
# Opt level: O0

shared_ptr<BER_CONTAINER> __thiscall
DynamicStringCallback::buildTypeWithValue(DynamicStringCallback *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<BER_CONTAINER> sVar1;
  string local_48 [32];
  shared_ptr<OctetType> local_28;
  DynamicStringCallback *this_local;
  
  this_local = this;
  (**(code **)(in_RSI + 0x18))();
  std::make_shared<OctetType,std::__cxx11::string_const>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28);
  std::shared_ptr<BER_CONTAINER>::shared_ptr<OctetType,void>
            ((shared_ptr<BER_CONTAINER> *)this,&local_28);
  Catch::clara::std::shared_ptr<OctetType>::~shared_ptr(&local_28);
  std::__cxx11::string::~string(local_48);
  sVar1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<BER_CONTAINER>)
         sVar1.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BER_CONTAINER> buildTypeWithValue() override {
      return std::make_shared<OctetType>(m_callback());
    }